

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

_Bool is_matching_txid(wally_tx *tx,uchar *txid,size_t txid_len)

{
  int iVar1;
  uchar src_txid [32];
  
  if ((txid != (uchar *)0x0 && tx != (wally_tx *)0x0) &&
     (iVar1 = wally_tx_get_txid(tx,src_txid,0x20), iVar1 == 0)) {
    iVar1 = bcmp(src_txid,txid,0x20);
    wally_clear(src_txid,0x20);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

static bool is_matching_txid(const struct wally_tx *tx,
                             const unsigned char *txid, size_t txid_len)
{
    unsigned char src_txid[WALLY_TXHASH_LEN];
    bool ret;

    if (!tx || !txid || txid_len != WALLY_TXHASH_LEN)
        return false;

    if (wally_tx_get_txid(tx, src_txid, sizeof(src_txid)) != WALLY_OK)
        return false;

    ret = memcmp(src_txid, txid, txid_len) == 0;
    wally_clear(src_txid, sizeof(src_txid));
    return ret;
}